

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_listener.c
# Opt level: O2

apx_serverEventListener_t * apx_serverEventListener_clone(apx_serverEventListener_t *other)

{
  _func_void_void_ptr_apx_serverConnection_tag_ptr *p_Var1;
  apx_serverEventListener_t *paVar2;
  
  if ((other != (apx_serverEventListener_t *)0x0) &&
     (paVar2 = (apx_serverEventListener_t *)malloc(0x18), paVar2 != (apx_serverEventListener_t *)0x0
     )) {
    paVar2->serverDisconnect1 = other->serverDisconnect1;
    p_Var1 = other->serverConnect1;
    paVar2->arg = other->arg;
    paVar2->serverConnect1 = p_Var1;
    return paVar2;
  }
  return (apx_serverEventListener_t *)0x0;
}

Assistant:

apx_serverEventListener_t *apx_serverEventListener_clone(apx_serverEventListener_t *other)
{
   if (other != 0)
   {
      apx_serverEventListener_t *self = (apx_serverEventListener_t*) malloc(sizeof(apx_serverEventListener_t));
      if (self != 0)
      {
         *self = *other;
      }
      return self;
   }
   return (apx_serverEventListener_t*) 0;
}